

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  bool bVar1;
  LogMessage *pLVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  string component;
  string package_name;
  string delimiter;
  string local_50;
  
  package_name._M_dataplus._M_p = (pointer)&package_name.field_2;
  package_name._M_string_length = 0;
  package_name.field_2._M_local_buf[0] = '\0';
  if ((*(byte *)(*(long *)(file + 0x78) + 0x29) & 2) == 0) {
    std::__cxx11::string::_M_assign((string *)&package_name);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&package_name);
    pcVar5 = "::";
    lVar3 = std::__cxx11::string::find((char *)&package_name,0x402ea0);
    if (lVar3 != -1) {
      bVar1 = false;
      goto LAB_002c8a6c;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)&delimiter,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0x1a9);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&delimiter,"ruby_package option should be in the form of:");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," \'A::B::C\' and not \'A.B.C\'");
    internal::LogFinisher::operator=((LogFinisher *)&component,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&delimiter);
  }
  pcVar5 = ".";
  bVar1 = true;
LAB_002c8a6c:
  std::__cxx11::string::string((string *)&delimiter,pcVar5,(allocator *)&component);
  iVar4 = 0;
  while (package_name._M_string_length != 0) {
    lVar3 = std::__cxx11::string::find((string *)&package_name,(ulong)&delimiter);
    component._M_dataplus._M_p = (pointer)&component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)&component);
      std::__cxx11::string::assign((char *)&package_name);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&package_name);
      std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&package_name);
      std::__cxx11::string::operator=((string *)&package_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (bVar1) {
      PackageToModule(&local_50,&component);
      std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"module $name$\n",(char (*) [5])0x3de831,&component);
    io::Printer::Indent(printer);
    iVar4 = iVar4 + 1;
    std::__cxx11::string::~string((string *)&component);
  }
  std::__cxx11::string::~string((string *)&delimiter);
  std::__cxx11::string::~string((string *)&package_name);
  return iVar4;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (package_name.find("::") != std::string::npos) {
      need_change_to_module = false;
    } else {
      GOOGLE_LOG(WARNING) << "ruby_package option should be in the form of:"
                          << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = file->package();
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  int delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print(
      "module $name$\n",
      "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}